

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O1

int_type __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::get(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      *this)

{
  int iVar1;
  char local_9;
  
  this->chars_read = this->chars_read + 1;
  iVar1 = (**((this->ia).
              super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->_vptr_input_adapter_protocol)();
  this->current = iVar1;
  if (iVar1 != -1) {
    local_9 = (char)iVar1;
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(&this->token_string,&local_9);
  }
  return this->current;
}

Assistant:

std::char_traits<char>::int_type get()
{
++chars_read;
current = ia->get_character();
if (JSON_LIKELY(current != std::char_traits<char>::eof()))
{
token_string.push_back(std::char_traits<char>::to_char_type(current));
}
return current;
}